

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_equip(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  wchar_t *p_00;
  wchar_t local_60;
  wchar_t ind;
  int iStack_4c;
  _Bool negated;
  wchar_t nalloc;
  wchar_t nind;
  int *einds;
  char *s;
  char *eopts;
  wchar_t sval;
  wchar_t tval;
  start_item *si;
  player_class *c;
  parser *p_local;
  
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar6 = parser_getsym(p,"tval");
    wVar2 = tval_find_idx(pcVar6);
    if (wVar2 < L'\0') {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      pcVar6 = parser_getsym(p,"sval");
      wVar3 = lookup_sval(wVar2,pcVar6);
      if (wVar3 < L'\0') {
        p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      else {
        pcVar6 = parser_getsym(p,"eopts");
        pcVar6 = string_make(pcVar6);
        _nalloc = (void *)0x0;
        iStack_4c = 0;
        ind = L'\0';
        einds = (int *)strtok(pcVar6," |");
        while (einds != (int *)0x0) {
          _Var1 = prefix((char *)einds,"NOT-");
          if (_Var1) {
            einds = einds + 1;
          }
          local_60 = lookup_option((char *)einds);
          if ((local_60 < L'\x01') || (iVar4 = option_type(local_60), iVar4 != 1)) {
            iVar4 = strcmp((char *)einds,"none");
            if (iVar4 != 0) {
              mem_free(_nalloc);
              string_free(pcVar6);
              return PARSE_ERROR_INVALID_OPTION;
            }
          }
          else {
            if (ind + L'\xfffffffe' <= iStack_4c) {
              if (ind == L'\0') {
                ind = L'\x02';
              }
              else {
                ind = ind << 1;
              }
              _nalloc = mem_realloc(_nalloc,(long)ind << 2);
            }
            if (_Var1) {
              local_60 = -local_60;
            }
            *(wchar_t *)((long)_nalloc + (long)iStack_4c * 4) = local_60;
            *(undefined4 *)((long)_nalloc + (long)(iStack_4c + 1) * 4) = 0;
            iStack_4c = iStack_4c + 1;
          }
          einds = (int *)strtok((char *)0x0," |");
        }
        string_free(pcVar6);
        p_00 = (wchar_t *)mem_zalloc(0x20);
        *p_00 = wVar2;
        p_00[1] = wVar3;
        wVar2 = parser_getuint(p,"min");
        p_00[2] = wVar2;
        wVar2 = parser_getuint(p,"max");
        p_00[3] = wVar2;
        *(void **)(p_00 + 4) = _nalloc;
        if ((p_00[2] < L'd') && (p_00[3] < L'd')) {
          *(undefined8 *)(p_00 + 6) = *(undefined8 *)((long)pvVar5 + 0xe8);
          *(wchar_t **)((long)pvVar5 + 0xe8) = p_00;
          p_local._4_4_ = PARSE_ERROR_NONE;
        }
        else {
          mem_free(*(void **)(p_00 + 4));
          mem_free(p_00);
          p_local._4_4_ = PARSE_ERROR_INVALID_ITEM_NUMBER;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_equip(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct start_item *si;
	int tval, sval;
	char *eopts;
	char *s;
	int *einds;
	int nind, nalloc;

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	sval = lookup_sval(tval, parser_getsym(p, "sval"));
	if (sval < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	eopts = string_make(parser_getsym(p, "eopts"));
	einds = NULL;
	nind = 0;
	nalloc = 0;
	s = strtok(eopts, " |");
	while (s) {
		bool negated = false;
		int ind;

		if (prefix(s, "NOT-")) {
			negated = true;
			s += 4;
		}
		ind = lookup_option(s);
		if (ind > 0 && option_type(ind) == OP_BIRTH) {
			if (nind >= nalloc - 2) {
				if (nalloc == 0) {
					nalloc = 2;
				} else {
					nalloc *= 2;
				}
				einds = mem_realloc(einds,
					nalloc * sizeof(*einds));
			}
			einds[nind] = (negated) ? -ind : ind;
			einds[nind + 1] = 0;
			++nind;
		} else if (!streq(s, "none")) {
			mem_free(einds);
			string_free(eopts);
			return PARSE_ERROR_INVALID_OPTION;
		}
		s = strtok(NULL, " |");
	}
	string_free(eopts);

	si = mem_zalloc(sizeof *si);
	si->tval = tval;
	si->sval = sval;
	si->min = parser_getuint(p, "min");
	si->max = parser_getuint(p, "max");
	si->eopts = einds;

	if (si->min > 99 || si->max > 99) {
		mem_free(si->eopts);
		mem_free(si);
		return PARSE_ERROR_INVALID_ITEM_NUMBER;
	}

	si->next = c->start_items;
	c->start_items = si;

	return PARSE_ERROR_NONE;
}